

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_DefaultWithUnterminatedHex_Test::FuzzTest_DefaultWithUnterminatedHex_Test
          (FuzzTest_DefaultWithUnterminatedHex_Test *this)

{
  FuzzTest_DefaultWithUnterminatedHex_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__FuzzTest_DefaultWithUnterminatedHex_Test_00a15260;
  return;
}

Assistant:

TEST(FuzzTest, DefaultWithUnterminatedHex) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "\035"
             message_type {
               name: "A"
               field {
                 name: "f"
                 number: 1
                 label: LABEL_OPTIONAL
                 type: TYPE_BYTES
                 default_value: "\\x"
               }
             }
           })pb"));
}